

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorSorting.cpp
# Opt level: O0

double strToDouble(string *str,char ch)

{
  char *__nptr;
  double dVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  undefined8 local_40;
  char *local_38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  undefined8 local_20;
  char local_11;
  string *psStack_10;
  char ch_local;
  string *str_local;
  
  local_11 = ch;
  psStack_10 = str;
  local_30._M_current = (char *)std::__cxx11::string::begin();
  local_38 = (char *)std::__cxx11::string::end();
  local_28 = std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                       (local_30,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )local_38,&local_11);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_20,&local_28);
  local_48._M_current = (char *)std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_40,&local_48);
  std::__cxx11::string::erase(str,local_20,local_40);
  __nptr = (char *)std::__cxx11::string::c_str();
  dVar1 = atof(__nptr);
  return dVar1;
}

Assistant:

double strToDouble(string str, char ch) {
    str.erase(remove(str.begin(), str.end(), ch), str.end());
    return atof(str.c_str());
}